

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalculateProbability.cc
# Opt level: O0

JointProbabilityState *
discAndCalcJointProbability(double *firstVector,double *secondVector,int vectorLength)

{
  void *__ptr;
  void *__ptr_00;
  int in_ECX;
  JointProbabilityState *in_RDI;
  int unaff_retaddr;
  uint *in_stack_00000008;
  uint *in_stack_00000010;
  uint *secondNormalisedVector;
  uint *firstNormalisedVector;
  undefined1 local_58 [12];
  int in_stack_ffffffffffffffb4;
  uint *in_stack_ffffffffffffffb8;
  double *in_stack_ffffffffffffffc0;
  
  __ptr = calloc((long)in_ECX,4);
  __ptr_00 = calloc((long)in_ECX,4);
  normaliseArray(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  normaliseArray(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  calculateJointProbability(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  memcpy(in_RDI,local_58,0x30);
  free(__ptr);
  free(__ptr_00);
  return in_RDI;
}

Assistant:

JointProbabilityState discAndCalcJointProbability(double *firstVector, double *secondVector, int vectorLength) {
  uint *firstNormalisedVector = (uint *) calloc(vectorLength,sizeof(uint));
  uint *secondNormalisedVector = (uint *) calloc(vectorLength,sizeof(uint));
  JointProbabilityState state;
  
  normaliseArray(firstVector,firstNormalisedVector,vectorLength);
  normaliseArray(secondVector,secondNormalisedVector,vectorLength);

  state = calculateJointProbability(firstNormalisedVector,secondNormalisedVector,vectorLength);

  free(firstNormalisedVector);
  free(secondNormalisedVector);

  return state;
}